

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pointer.cpp
# Opt level: O1

void __thiscall duckdb::DataPointer::DataPointer(DataPointer *this,DataPointer *other)

{
  CompressionType CVar1;
  uint64_t uVar2;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var5;
  block_id_t bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  BlockPointer __tmp;
  undefined4 local_38;
  undefined4 uStack_34;
  uint32_t uStack_30;
  uint32_t uStack_2c;
  
  (this->block_pointer).block_id = -1;
  (this->block_pointer).offset = 0;
  (this->block_pointer).unused_padding = 0;
  BaseStatistics::BaseStatistics(&this->statistics,&other->statistics);
  (this->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
       (ColumnSegmentState *)0x0;
  uVar2 = this->row_start;
  this->row_start = other->row_start;
  other->row_start = uVar2;
  uVar2 = this->tuple_count;
  this->tuple_count = other->tuple_count;
  other->tuple_count = uVar2;
  bVar6 = (this->block_pointer).block_id;
  uVar7 = (this->block_pointer).offset;
  uVar8 = (this->block_pointer).unused_padding;
  uVar9 = (other->block_pointer).offset;
  uVar10 = (other->block_pointer).unused_padding;
  (this->block_pointer).block_id = (other->block_pointer).block_id;
  (this->block_pointer).offset = uVar9;
  (this->block_pointer).unused_padding = uVar10;
  local_38 = (undefined4)bVar6;
  uStack_34 = (undefined4)((ulong)bVar6 >> 0x20);
  *(undefined4 *)&(other->block_pointer).block_id = local_38;
  *(undefined4 *)((long)&(other->block_pointer).block_id + 4) = uStack_34;
  (other->block_pointer).offset = uVar7;
  (other->block_pointer).unused_padding = uVar8;
  CVar1 = this->compression_type;
  this->compression_type = other->compression_type;
  other->compression_type = CVar1;
  _Var3._M_head_impl =
       (this->segment_state).
       super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
       .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
  (this->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
       (ColumnSegmentState *)0x0;
  _Var4._M_head_impl =
       (other->segment_state).
       super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
       .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
  (other->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
       (ColumnSegmentState *)0x0;
  _Var5._M_head_impl =
       (this->segment_state).
       super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
       .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
  (this->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var5._M_head_impl != (ColumnSegmentState *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_ColumnSegmentState + 8))();
  }
  _Var4._M_head_impl =
       (other->segment_state).
       super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
       .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
  (other->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var4._M_head_impl != (ColumnSegmentState *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_ColumnSegmentState + 8))();
    return;
  }
  return;
}

Assistant:

DataPointer::DataPointer(DataPointer &&other) noexcept : statistics(std::move(other.statistics)) {
	std::swap(row_start, other.row_start);
	std::swap(tuple_count, other.tuple_count);
	std::swap(block_pointer, other.block_pointer);
	std::swap(compression_type, other.compression_type);
	std::swap(segment_state, other.segment_state);
}